

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O3

string * bssl::GetTempDir_abi_cxx11_(void)

{
  char *__s;
  string *psVar1;
  string *extraout_RAX;
  long *in_RDI;
  
  __s = getenv("TMPDIR");
  if ((__s != (char *)0x0) && (*__s != '\0')) {
    *in_RDI = (long)(in_RDI + 2);
    strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>();
    psVar1 = (string *)*in_RDI;
    if (*(char *)((long)psVar1 + in_RDI[1] + -1) != '/') {
      psVar1 = (string *)std::__cxx11::string::push_back((char)in_RDI);
    }
    return psVar1;
  }
  *in_RDI = (long)(in_RDI + 2);
  std::__cxx11::string::_M_construct<char_const*>();
  return extraout_RAX;
}

Assistant:

static std::string GetTempDir() {
#if defined(OPENSSL_WINDOWS)
  char buf[MAX_PATH + 1];
  DWORD len = GetTempPathA(sizeof(buf), buf);
  return std::string(buf, len);
#else
  const char *tmpdir = getenv("TMPDIR");
  if (tmpdir != nullptr && *tmpdir != '\0') {
    std::string ret = tmpdir;
    if (ret.back() != '/') {
      ret.push_back('/');
    }
    return ret;
  }
#if defined(OPENSSL_ANDROID)
  return "/data/local/tmp/";
#else
  return "/tmp/";
#endif
#endif
}